

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout.cpp
# Opt level: O2

QSizeF __thiscall
QGraphicsAnchorLayout::sizeHint(QGraphicsAnchorLayout *this,SizeHint which,QSizeF *constraint)

{
  double dVar1;
  double dVar2;
  QGraphicsAnchorLayoutPrivate *this_00;
  const_reference pvVar3;
  long in_FS_OFFSET;
  QSizeF QVar4;
  qreal bottom;
  qreal right;
  qreal top;
  qreal left;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QGraphicsAnchorLayoutPrivate *)
            (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
  QGraphicsAnchorLayoutPrivate::calculateGraphs(this_00);
  pvVar3 = std::array<double,_3UL>::operator[]((this_00->sizeHints).m_data,(ulong)which);
  dVar1 = *pvVar3;
  pvVar3 = std::array<double,_3UL>::operator[]((this_00->sizeHints).m_data + 1,(ulong)which);
  dVar2 = *pvVar3;
  local_40 = -NAN;
  local_48 = -NAN;
  local_50 = -NAN;
  local_58 = -NAN;
  (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[3])
            (this,&local_40,&local_48,&local_50,&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar4.wd = dVar1 + local_40 + local_50;
    QVar4.ht = dVar2 + local_48 + local_58;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QSizeF QGraphicsAnchorLayout::sizeHint(Qt::SizeHint which, const QSizeF &constraint) const
{
    Q_UNUSED(constraint);
    Q_D(const QGraphicsAnchorLayout);

    // Some setup calculations are delayed until the information is
    // actually needed, avoiding unnecessary recalculations when
    // adding multiple anchors.

    // sizeHint() / effectiveSizeHint() already have a cache
    // mechanism, using invalidate() to force recalculation. However
    // sizeHint() is called three times after invalidation (for max,
    // min and pref), but we just need do our setup once.

    const_cast<QGraphicsAnchorLayoutPrivate *>(d)->calculateGraphs();

    // ### apply constraint!
    QSizeF engineSizeHint{d->sizeHints[Qt::Horizontal][which],
                          d->sizeHints[Qt::Vertical][which]};

    qreal left, top, right, bottom;
    getContentsMargins(&left, &top, &right, &bottom);

    return engineSizeHint + QSizeF(left + right, top + bottom);
}